

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::bt_peer_connection::on_have_all(bt_peer_connection *this,int received)

{
  int iVar1;
  error_code local_20;
  
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  if (((this->super_peer_connection).field_0x889 & 4) != 0) {
    iVar1 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
    if (iVar1 == 1) {
      peer_connection::incoming_have_all(&this->super_peer_connection);
      maybe_send_hash_request(this);
      return;
    }
  }
  boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
            (&local_20,invalid_have_all,(type *)0x0);
  (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
            (this,&local_20,1,2);
  return;
}

Assistant:

void bt_peer_connection::on_have_all(int received)
	{
		INVARIANT_CHECK;

		received_bytes(0, received);
		if (!m_supports_fast || m_recv_buffer.packet_size() != 1)
		{
			disconnect(errors::invalid_have_all, operation_t::bittorrent, peer_error);
			return;
		}
		incoming_have_all();
		maybe_send_hash_request();
	}